

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O0

PrimaryHeader * lrit::getHeader<lrit::PrimaryHeader>(Buffer *b,int pos)

{
  int iVar1;
  size_t in_RCX;
  int in_EDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  Buffer *in_RSI;
  PrimaryHeader *in_RDI;
  HeaderReader<lrit::PrimaryHeader> r;
  HeaderReader<lrit::PrimaryHeader> *in_stack_ffffffffffffffd0;
  
  HeaderReader<lrit::PrimaryHeader>::HeaderReader
            ((HeaderReader<lrit::PrimaryHeader> *)&stack0xffffffffffffffc8,in_RSI,in_EDX);
  HeaderReader<lrit::PrimaryHeader>::getHeader(in_stack_ffffffffffffffd0);
  iVar1 = (int)in_RDI;
  HeaderReader<lrit::PrimaryHeader>::read
            ((HeaderReader<lrit::PrimaryHeader> *)&stack0xffffffffffffffc8,iVar1 + 4,__buf,in_RCX);
  HeaderReader<lrit::PrimaryHeader>::read
            ((HeaderReader<lrit::PrimaryHeader> *)&stack0xffffffffffffffc8,iVar1 + 8,__buf_00,in_RCX
            );
  HeaderReader<lrit::PrimaryHeader>::read
            ((HeaderReader<lrit::PrimaryHeader> *)&stack0xffffffffffffffc8,iVar1 + 0x10,__buf_01,
             in_RCX);
  return in_RDI;
}

Assistant:

PrimaryHeader getHeader(const Buffer& b, int pos) {
  auto r = HeaderReader<PrimaryHeader>(b, pos);
  auto h = r.getHeader();
  r.read(&h.fileType);
  r.read(&h.totalHeaderLength);
  r.read(&h.dataLength);
  return h;
}